

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O2

float tcu::computeBilinearSearchStepFromFloatQuad(LookupPrecision *prec,ColorQuad *quad)

{
  float fVar1;
  Vec4 minStep;
  Vec4 stepCount;
  Vec4 maxD;
  Vec4 d3;
  Vec4 d2;
  Vec4 d1;
  Vec4 d0;
  tcu local_b0 [16];
  tcu local_a0 [16];
  tcu local_90 [16];
  tcu local_80 [16];
  tcu local_70 [16];
  tcu local_60 [16];
  Vector<float,_4> local_50;
  tcu local_40 [16];
  
  operator-(local_60,&quad->p10,&quad->p00);
  abs<float,4>((tcu *)&local_50,(Vector<float,_4> *)local_60);
  operator-(local_70,&quad->p01,&quad->p00);
  abs<float,4>(local_60,(Vector<float,_4> *)local_70);
  operator-(local_80,&quad->p11,&quad->p10);
  abs<float,4>(local_70,(Vector<float,_4> *)local_80);
  operator-(local_90,&quad->p11,&quad->p01);
  abs<float,4>(local_80,(Vector<float,_4> *)local_90);
  max<float,4>(local_b0,(Vector<float,_4> *)local_70,(Vector<float,_4> *)local_80);
  max<float,4>(local_a0,(Vector<float,_4> *)local_60,(Vector<float,_4> *)local_b0);
  max<float,4>(local_90,&local_50,(Vector<float,_4> *)local_a0);
  operator/(local_a0,(Vector<float,_4> *)local_90,&prec->colorThreshold);
  operator+(local_40,1.0,(Vector<float,_4> *)local_a0);
  operator/(local_b0,1.0,(Vector<float,_4> *)local_40);
  fVar1 = minComp<float,4>((Vector<float,_4> *)local_b0);
  if (fVar1 <= 1.5258789e-05) {
    fVar1 = 1.5258789e-05;
  }
  return fVar1;
}

Assistant:

static float computeBilinearSearchStepFromFloatQuad (const LookupPrecision&	prec,
													 const ColorQuad&		quad)
{
	DE_ASSERT(boolAll(greaterThan(prec.colorThreshold, Vec4(0.0f))));

	const int		maxSteps	= 1<<16;
	const Vec4		d0			= abs(quad.p10 - quad.p00);
	const Vec4		d1			= abs(quad.p01 - quad.p00);
	const Vec4		d2			= abs(quad.p11 - quad.p10);
	const Vec4		d3			= abs(quad.p11 - quad.p01);
	const Vec4		maxD		= max(d0, max(d1, max(d2, d3)));
	const Vec4		stepCount	= maxD / prec.colorThreshold;
	const Vec4		minStep		= 1.0f / (stepCount + 1.0f);
	const float		step		= de::max(minComp(minStep), 1.0f / float(maxSteps));

	return step;
}